

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* argagg::convert::arg<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (char *s)

{
  char *pcVar1;
  char *in_RSI;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  size_t len;
  char *local_30;
  unsigned_long local_28;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (*in_RSI != '\0') {
    local_30 = in_RSI;
    pcVar1 = strchr(in_RSI,0x2c);
    if (pcVar1 != (char *)0x0) {
      do {
        local_28 = (long)pcVar1 - (long)in_RSI;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,unsigned_long&>(in_RDI,&local_30,&local_28);
        in_RSI = local_30 + local_28 + 1;
        local_30 = in_RSI;
        pcVar1 = strchr(in_RSI,0x2c);
      } while (pcVar1 != (char *)0x0);
    }
    local_28 = strlen(in_RSI);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,unsigned_long>(in_RDI,&local_30,&local_28);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> arg(const char* s)
  {
    std::vector<std::string> ret {};
    if (std::strlen(s) == 0) {
      return ret;
    }
    while (true) {
      const char* token = std::strchr(s, ',');
      if (token == nullptr) {
        ret.emplace_back(s, std::strlen(s));
        break;
      }
      std::size_t len = static_cast<std::size_t>(token - s);
      ret.emplace_back(s, len);
      s += len + 1;
    }
    return ret;
  }